

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::NameMapper::GetDefaultExpression
          (NameMapper *this,MultiFileColumnDefinition *column,bool is_root)

{
  MultiFileColumnMapper *this_00;
  undefined8 extraout_RAX;
  char in_CL;
  undefined7 in_register_00000011;
  MultiFileColumnDefinition *this_01;
  _func_int **local_70;
  LogicalType local_68;
  Value local_50;
  
  this_01 = (MultiFileColumnDefinition *)CONCAT71(in_register_00000011,is_root);
  if ((this_01->default_expression).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    if (in_CL != '\0') {
      this_00 = (MultiFileColumnMapper *)(column->name)._M_string_length;
      MultiFileColumnDefinition::GetIdentifierName_abi_cxx11_((string *)&local_50,this_01);
      MultiFileColumnMapper::ThrowColumnNotFoundError(this_00,(string *)&local_50);
      Value::~Value(&local_50);
      LogicalType::~LogicalType(&local_68);
      _Unwind_Resume(extraout_RAX);
    }
    LogicalType::LogicalType(&local_68,&this_01->type);
    Value::Value(&local_50,&local_68);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_70,&local_50);
    (this->super_ColumnMapper)._vptr_ColumnMapper = local_70;
    local_70 = (_func_int **)0x0;
    Value::~Value(&local_50);
    LogicalType::~LogicalType(&local_68);
  }
  else {
    FieldIdMapper::GetDefault((FieldIdMapper *)this,this_01);
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> GetDefaultExpression(const MultiFileColumnDefinition &column, bool is_root) const override {
		if (column.default_expression) {
			// we have an explicit default - return it
			return FieldIdMapper::GetDefault(column);
		}
		// no explicit default and no match
		if (is_root) {
			// no match found in a root column - throw an error
			mapper.ThrowColumnNotFoundError(column.GetIdentifierName());
		}
		// no match found in a struct field - replace with NULL
		return make_uniq<BoundConstantExpression>(Value(column.type));
	}